

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

void __thiscall
CLI::Transformer::
Transformer<std::array<std::pair<std::__cxx11::string,int>,2ul>,std::__cxx11::string(*)(std::__cxx11::string)>
          (Transformer *this,
          array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_2UL>
          *mapping,_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   *filter_function)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  string *psVar4;
  bool bVar5;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  filter_fn;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  function<std::__cxx11::string(std::__cxx11::string&)> *local_a8;
  undefined1 local_a0 [40];
  undefined8 local_78 [2];
  undefined1 local_68 [24];
  _Any_data local_50;
  _Manager_type local_40;
  
  *(undefined8 *)&(this->super_Validator).desc_function_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Validator).desc_function_.super__Function_base._M_functor + 8)
       = 0;
  (this->super_Validator).desc_function_._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:58:49)>
       ::_M_invoke;
  (this->super_Validator).desc_function_.super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:58:49)>
       ::_M_manager;
  *(undefined8 *)&(this->super_Validator).func_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Validator).func_.super__Function_base._M_functor + 8) = 0;
  (this->super_Validator).func_._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:62:53)>
       ::_M_invoke;
  (this->super_Validator).func_.super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/include/CLI/Validators.hpp:62:53)>
       ::_M_manager;
  (this->super_Validator).name_._M_dataplus._M_p = (pointer)&(this->super_Validator).name_.field_2;
  (this->super_Validator).name_._M_string_length = 0;
  (this->super_Validator).name_.field_2._M_local_buf[0] = '\0';
  (this->super_Validator).application_index_ = -1;
  (this->super_Validator).active_ = true;
  (this->super_Validator).non_modifying_ = false;
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object =
       (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
        *)0x0;
  local_c8._8_8_ = 0;
  if (filter_function !=
      (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
       *)0x0) {
    pcStack_b0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               ::_M_manager;
    local_c8._M_unused._0_8_ = (undefined8)filter_function;
  }
  local_a8 = (function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
  ;
  bVar5 = false;
  lVar3 = 0;
  psVar4 = (string *)local_a0;
  do {
    *(string **)psVar4 = psVar4 + 0x10;
    pcVar1 = mapping->_M_elems[lVar3].first._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              (psVar4,pcVar1,pcVar1 + mapping->_M_elems[lVar3].first._M_string_length);
    *(int *)(psVar4 + 0x20) = mapping->_M_elems[lVar3].second;
    lVar3 = 1;
    bVar2 = !bVar5;
    bVar5 = true;
    psVar4 = (string *)local_78;
  } while (bVar2);
  psVar4 = (string *)local_a0;
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)this,(anon_class_80_1_b5464bae *)psVar4);
  lVar3 = 0;
  do {
    if (local_68 + lVar3 != *(undefined1 **)((long)local_78 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_78 + lVar3));
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x50);
  bVar5 = false;
  lVar3 = 0;
  do {
    *(string **)psVar4 = psVar4 + 0x10;
    pcVar1 = mapping->_M_elems[lVar3].first._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              (psVar4,pcVar1,pcVar1 + mapping->_M_elems[lVar3].first._M_string_length);
    *(int *)(psVar4 + 0x20) = mapping->_M_elems[lVar3].second;
    lVar3 = 1;
    psVar4 = (string *)local_78;
    bVar2 = !bVar5;
    bVar5 = true;
  } while (bVar2);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_50,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_c8);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            (local_a8,(anon_class_112_2_fb0b3e5d *)local_a0);
  if (local_40 != (_Manager_type)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  lVar3 = 0;
  do {
    if (local_68 + lVar3 != *(undefined1 **)((long)local_78 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_78 + lVar3));
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x50);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  return;
}

Assistant:

explicit Transformer(T mapping, F filter_function) {

        static_assert(detail::pair_adaptor<typename detail::element_type<T>::type>::value,
                      "mapping must produce value pairs");
        // Get the type of the contained item - requires a container have ::value_type
        // if the type does not have first_type and second_type, these are both value_type
        using element_t = typename detail::element_type<T>::type;             // Removes (smart) pointers if needed
        using item_t = typename detail::pair_adaptor<element_t>::first_type;  // Is value_type if not a map
        using local_item_t = typename IsMemberType<item_t>::type;             // Will convert bad types to good ones
                                                                              // (const char * to std::string)

        // Make a local copy of the filter function, using a std::function if not one already
        std::function<local_item_t(local_item_t)> filter_fn = filter_function;

        // This is the type name for help, it will take the current version of the set contents
        desc_function_ = [mapping]() { return detail::generate_map(detail::smart_deref(mapping)); };

        func_ = [mapping, filter_fn](std::string &input) {
            using CLI::detail::lexical_cast;
            local_item_t b;
            if(!lexical_cast(input, b)) {
                return std::string();
                // there is no possible way we can match anything in the mapping if we can't convert so just return
            }
            if(filter_fn) {
                b = filter_fn(b);
            }
            auto res = detail::search(mapping, b, filter_fn);
            if(res.first) {
                input = detail::value_string(detail::pair_adaptor<element_t>::second(*res.second));
            }
            return std::string{};
        };
    }